

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O0

void __thiscall rw::BBox::calculate(BBox *this,V3d *points,int32 n)

{
  float32 *pfVar1;
  float32 fVar2;
  V3d *pVVar3;
  int local_1c;
  V3d *pVStack_18;
  int32 n_local;
  V3d *points_local;
  BBox *this_local;
  
  fVar2 = points->y;
  (this->inf).x = points->x;
  (this->inf).y = fVar2;
  (this->inf).z = points->z;
  fVar2 = points->y;
  (this->sup).x = points->x;
  (this->sup).y = fVar2;
  (this->sup).z = points->z;
  local_1c = n;
  pVVar3 = points;
  while (pVStack_18 = pVVar3, local_1c = local_1c + -1, local_1c != 0) {
    pVVar3 = pVStack_18 + 1;
    if ((float)pVVar3->x < (float)(this->inf).x) {
      (this->inf).x = pVVar3->x;
    }
    if ((float)pVStack_18[1].y < (float)(this->inf).y) {
      (this->inf).y = pVStack_18[1].y;
    }
    if ((float)pVStack_18[1].z < (float)(this->inf).z) {
      (this->inf).z = pVStack_18[1].z;
    }
    if ((float)(this->sup).x <= (float)pVVar3->x && (float)pVVar3->x != (float)(this->sup).x) {
      (this->sup).x = pVVar3->x;
    }
    pfVar1 = &(this->sup).y;
    if ((float)*pfVar1 <= (float)pVStack_18[1].y && (float)pVStack_18[1].y != (float)*pfVar1) {
      (this->sup).y = pVStack_18[1].y;
    }
    pfVar1 = &(this->sup).z;
    if ((float)*pfVar1 <= (float)pVStack_18[1].z && (float)pVStack_18[1].z != (float)*pfVar1) {
      (this->sup).z = pVStack_18[1].z;
    }
  }
  return;
}

Assistant:

void
BBox::calculate(V3d *points, int32 n)
{
	this->inf = points[0];
	this->sup = points[0];
	while(--n){
		points++;
		if(points->x < this->inf.x)
			this->inf.x = points->x;
		if(points->y < this->inf.y)
			this->inf.y = points->y;
		if(points->z < this->inf.z)
			this->inf.z = points->z;
		if(points->x > this->sup.x)
			this->sup.x = points->x;
		if(points->y > this->sup.y)
			this->sup.y = points->y;
		if(points->z > this->sup.z)
			this->sup.z = points->z;
	}
}